

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_linearize_tests.cpp
# Opt level: O3

void cluster_linearize_tests::(anonymous_namespace)::
     TestDepGraphSerialization<bitset_detail::IntBitSet<unsigned_int>>
               (Cluster<bitset_detail::IntBitSet<unsigned_int>_> *cluster,string *hexenc)

{
  pointer pEVar1;
  pointer pEVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  pointer ppVar9;
  iterator pvVar10;
  uint uVar11;
  uint uVar12;
  iterator in_R9;
  iterator pvVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  long in_FS_OFFSET;
  readonly_property<bool> rVar17;
  const_string file;
  Span<const_unsigned_char> s;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  check_type cVar18;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  VectorWriter writer_1;
  shared_count sStack_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  VectorWriter writer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> encoding;
  DepGraph<bitset_detail::IntBitSet<unsigned_int>_> depgraph;
  DepGraph<bitset_detail::IntBitSet<unsigned_int>_> depgraph_read;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ser;
  char *local_80;
  char *local_78;
  char *local_70;
  element_type *local_68;
  shared_count sStack_60;
  SpanReader reader;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::DepGraph(&depgraph,cluster);
  lVar8 = (long)depgraph.entries.
                super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)depgraph.entries.
                super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar8 != 0) {
    uVar6 = ((long)depgraph.entries.
                   super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)depgraph.entries.
                   super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    uVar5 = 0;
    do {
      uVar14 = depgraph.entries.
               super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar5].ancestors.m_val;
      if ((uVar14 >> ((uint)uVar5 & 0x1f) & 1) == 0) {
        __assert_fail("depgraph.Ancestors(i)[i]",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                      ,0x108,
                      "void (anonymous namespace)::SanityCheck(const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                     );
      }
      if (uVar14 != 0) {
        uVar12 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
          }
        }
        uVar11 = ~uVar14;
        do {
          if ((depgraph.entries.
               super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar12].ancestors.m_val & uVar11) != 0) {
            __assert_fail("depgraph.Ancestors(i).IsSupersetOf(depgraph.Ancestors(a))",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                          ,0x10b,
                          "void (anonymous namespace)::SanityCheck(const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                         );
          }
          uVar14 = uVar14 - 1 & uVar14;
          uVar12 = 0;
          if (uVar14 != 0) {
            for (; (uVar14 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
            }
          }
        } while (uVar14 != 0);
      }
      uVar5 = (ulong)((uint)uVar5 + 1);
    } while (uVar5 <= uVar6 && uVar6 - uVar5 != 0);
    uVar5 = 0;
    do {
      uVar14 = 1;
      uVar16 = 0;
      do {
        if (((depgraph.entries.
              super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar5].ancestors.m_val >>
              (uVar14 - 1 & 0x1f) & 1) != 0) !=
            ((depgraph.entries.
              super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar16].descendants.m_val &
             1 << ((byte)uVar5 & 0x1f)) != 0)) {
          __assert_fail("depgraph.Ancestors(i)[j] == depgraph.Descendants(j)[i]",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                        ,0x111,
                        "void (anonymous namespace)::SanityCheck(const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                       );
        }
        uVar16 = (ulong)uVar14;
        uVar14 = uVar14 + 1;
      } while (uVar16 <= uVar6 && uVar6 - uVar16 != 0);
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (uVar5 <= uVar6 && uVar6 - uVar5 != 0);
    uVar14 = 1;
    uVar5 = 0;
    do {
      uVar12 = depgraph.entries.
               super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar5].descendants.m_val &
               depgraph.entries.
               super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar5].ancestors.m_val;
      in_R9 = (iterator)(ulong)uVar12;
      if (uVar12 != 1 << ((char)uVar14 - 1U & 0x1f)) goto LAB_00318500;
      uVar5 = (ulong)uVar14;
      uVar14 = uVar14 + 1;
    } while (uVar5 <= uVar6 && uVar6 - uVar5 != 0);
  }
  writer_1.vchData = &ser;
  ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  writer_1.nPos = 0;
  ::(anonymous_namespace)::DepGraphFormatter::
  Ser<VectorWriter,bitset_detail::IntBitSet<unsigned_int>>(&writer_1,&depgraph);
  reader.m_data.m_size =
       (long)ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  reader.m_data.m_data =
       ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  depgraph_read.entries.
  super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depgraph_read.entries.
  super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depgraph_read.entries.
  super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SpanReader::operator>>
            (&reader,(Wrapper<(anonymous_namespace)::DepGraphFormatter,_cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>_&>
                      *)&depgraph_read);
  if (((long)depgraph.entries.
             super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)depgraph.entries.
             super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
             ._M_impl.super__Vector_impl_data._M_start !=
       (long)depgraph_read.entries.
             super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)depgraph_read.entries.
             super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
             ._M_impl.super__Vector_impl_data._M_start) ||
     (bVar3 = std::__equal<false>::
              equal<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>>::Entry_const*,cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>>::Entry_const*>
                        (depgraph.entries.
                         super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         depgraph.entries.
                         super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         depgraph_read.entries.
                         super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                         ._M_impl.super__Vector_impl_data._M_start),
     pEVar2 = depgraph_read.entries.
              super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
     pEVar1 = depgraph_read.entries.
              super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
              ._M_impl.super__Vector_impl_data._M_start, !bVar3)) {
    __assert_fail("depgraph == decoded_depgraph",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                  ,0x11c,
                  "void (anonymous namespace)::SanityCheck(const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                 );
  }
  if (reader.m_data.m_size != 0) {
    __assert_fail("reader.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                  ,0x11d,
                  "void (anonymous namespace)::SanityCheck(const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                 );
  }
  if ((ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish ==
       ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start) ||
     (ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish[-1] != '\0')) {
    __assert_fail("ser.size() >= 1 && ser.back() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                  ,0x120,
                  "void (anonymous namespace)::SanityCheck(const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                 );
  }
  ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish + -1;
  reader.m_data.m_size =
       (long)ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  reader.m_data.m_data =
       ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  depgraph_read.entries.
  super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depgraph_read.entries.
  super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depgraph_read.entries.
  super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pEVar1 != (pointer)0x0) {
    operator_delete(pEVar1,(long)pEVar2 - (long)pEVar1);
  }
  SpanReader::operator>>
            (&reader,(Wrapper<(anonymous_namespace)::DepGraphFormatter,_cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>_&>
                      *)&depgraph_read);
  if (((long)depgraph.entries.
             super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)depgraph.entries.
             super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
             ._M_impl.super__Vector_impl_data._M_start !=
       (long)depgraph_read.entries.
             super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)depgraph_read.entries.
             super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
             ._M_impl.super__Vector_impl_data._M_start) ||
     (bVar3 = std::__equal<false>::
              equal<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>>::Entry_const*,cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>>::Entry_const*>
                        (depgraph.entries.
                         super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         depgraph.entries.
                         super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         depgraph_read.entries.
                         super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                         ._M_impl.super__Vector_impl_data._M_start), !bVar3)) {
    __assert_fail("depgraph == decoded_depgraph",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                  ,0x125,
                  "void (anonymous namespace)::SanityCheck(const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                 );
  }
  if (reader.m_data.m_size != 0) {
    __assert_fail("reader.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                  ,0x126,
                  "void (anonymous namespace)::SanityCheck(const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                 );
  }
  if (depgraph_read.entries.
      super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(depgraph_read.entries.
                    super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)depgraph_read.entries.
                          super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)depgraph_read.entries.
                          super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  lVar8 = (long)depgraph.entries.
                super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)depgraph.entries.
                super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (lVar8 >> 3) * -0x5555555555555555;
LAB_00318500:
  ppVar9 = (cluster->
           super__Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(cluster->
            super__Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar9 != lVar8) {
    __assert_fail("cluster.size() == depgraph.TxCount()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                  ,0x132,
                  "void (anonymous namespace)::VerifyDepGraphFromCluster(const Cluster<SetType> &, const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                 );
  }
  if (depgraph.entries.
      super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      depgraph.entries.
      super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar14 = 1;
    uVar5 = 0;
    do {
      if ((depgraph.entries.
           super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar5].feerate.fee != ppVar9[uVar5].first.fee)
         || (depgraph.entries.
             super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar5].feerate.size !=
             ppVar9[uVar5].first.size)) {
        __assert_fail("depgraph.FeeRate(i) == cluster[i].first",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                      ,0x135,
                      "void (anonymous namespace)::VerifyDepGraphFromCluster(const Cluster<SetType> &, const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                     );
      }
      uVar5 = (ulong)uVar14;
      uVar14 = uVar14 + 1;
    } while (uVar5 < uVar6);
    uVar5 = 0;
    do {
      uVar12 = 1 << ((byte)uVar5 & 0x1f);
      uVar14 = uVar12;
      do {
        uVar11 = uVar14;
        if (uVar11 == 0) {
          uVar14 = 0;
        }
        else {
          uVar15 = 0;
          uVar14 = uVar11;
          uVar7 = uVar11;
          if (uVar11 != 0) {
            for (; (uVar11 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
            }
          }
          do {
            uVar14 = uVar14 | ppVar9[uVar15].second.m_val;
            uVar7 = uVar7 - 1 & uVar7;
            uVar15 = 0;
            if (uVar7 != 0) {
              for (; (uVar7 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
          } while (uVar7 != 0);
        }
      } while (uVar11 != uVar14);
      in_R9 = (iterator)(uVar5 * 3);
      if (depgraph.entries.
          super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar5].ancestors.m_val != uVar11) {
        __assert_fail("depgraph.Ancestors(i) == ancestors",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                      ,0x144,
                      "void (anonymous namespace)::VerifyDepGraphFromCluster(const Cluster<SetType> &, const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                     );
      }
      if ((uVar11 & uVar12) == 0) {
        __assert_fail("ancestors[i]",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                      ,0x147,
                      "void (anonymous namespace)::VerifyDepGraphFromCluster(const Cluster<SetType> &, const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                     );
      }
      uVar14 = ppVar9[uVar5].second.m_val;
      if (uVar14 != 0) {
        uVar12 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
          }
        }
        in_R9 = (iterator)(ulong)uVar12;
        do {
          if ((uVar11 >> ((uint)in_R9 & 0x1f) & 1) == 0) {
            __assert_fail("ancestors[parent]",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                          ,0x14a,
                          "void (anonymous namespace)::VerifyDepGraphFromCluster(const Cluster<SetType> &, const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                         );
          }
          uVar14 = uVar14 - 1 & uVar14;
          uVar12 = 0;
          if (uVar14 != 0) {
            for (; (uVar14 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
            }
          }
          in_R9 = (iterator)(ulong)uVar12;
        } while (uVar14 != 0);
      }
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (uVar5 < uVar6);
  }
  writer.vchData = &encoding;
  encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  writer.nPos = 0;
  ::(anonymous_namespace)::DepGraphFormatter::
  Ser<VectorWriter,bitset_detail::IntBitSet<unsigned_int>>(&writer,&depgraph);
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/cluster_linearize_tests.cpp"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x22;
  file.m_begin = (iterator)&local_138;
  msg.m_end = in_R9;
  msg.m_begin = (iterator)ppVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_148,msg);
  writer_1.nPos = writer_1.nPos & 0xffffffffffffff00;
  writer_1.vchData =
       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&PTR__lazy_ostream_013ae088;
  sStack_158.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  s.m_size = (long)encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  s.m_data = encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  HexStr_abi_cxx11_((string *)&reader,s);
  if (reader.m_data.m_size == hexenc->_M_string_length) {
    if (reader.m_data.m_size == 0) {
      rVar17.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar4 = bcmp(reader.m_data.m_data,(hexenc->_M_dataplus)._M_p,reader.m_data.m_size);
      rVar17.super_class_property<bool>.value = (class_property<bool>)(iVar4 == 0);
    }
  }
  else {
    rVar17.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_70 = (char *)CONCAT71(local_70._1_7_,rVar17.super_class_property<bool>.value);
  local_68 = (element_type *)0x0;
  sStack_60.pi_ = (sp_counted_base *)0x0;
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/cluster_linearize_tests.cpp"
  ;
  local_78 = "";
  ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "B";
  ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  depgraph_read.entries.
  super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)depgraph_read.entries.
                        super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  depgraph_read.entries.
  super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae148;
  depgraph_read.entries.
  super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  pvVar10 = (iterator)0x1;
  pvVar13 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_70,(lazy_ostream *)&writer_1,1,2,REQUIRE,0xe732f1,
             (size_t)&local_80,0x22,&ser,"hexenc",&depgraph_read);
  boost::detail::shared_count::~shared_count(&sStack_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)reader.m_data.m_data != &local_48) {
    operator_delete(reader.m_data.m_data,local_48._M_allocated_capacity + 1);
  }
  reader.m_data.m_size =
       (long)encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  reader.m_data.m_data =
       encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  depgraph_read.entries.
  super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depgraph_read.entries.
  super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depgraph_read.entries.
  super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SpanReader::operator>>
            (&reader,(Wrapper<(anonymous_namespace)::DepGraphFormatter,_cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>_&>
                      *)&depgraph_read);
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/cluster_linearize_tests.cpp"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar18 = 0x31881b;
  file_00.m_end = (iterator)0x29;
  file_00.m_begin = (iterator)&local_178;
  msg_00.m_end = pvVar13;
  msg_00.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_188,
             msg_00);
  if ((long)depgraph.entries.
            super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)depgraph.entries.
            super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
            ._M_impl.super__Vector_impl_data._M_start ==
      (long)depgraph_read.entries.
            super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)depgraph_read.entries.
            super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
            ._M_impl.super__Vector_impl_data._M_start) {
    _cVar18 = 0x31884e;
    bVar3 = std::__equal<false>::
            equal<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>>::Entry_const*,cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>>::Entry_const*>
                      (depgraph.entries.
                       super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       depgraph.entries.
                       super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       depgraph_read.entries.
                       super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  }
  else {
    bVar3 = false;
  }
  writer_1.vchData =
       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
       CONCAT71(writer_1.vchData._1_7_,bVar3);
  writer_1.nPos = 0;
  sStack_158.pi_ = (sp_counted_base *)0x0;
  local_70 = "depgraph == depgraph_read";
  local_68 = (element_type *)0xe73322;
  ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "B";
  ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/cluster_linearize_tests.cpp"
  ;
  local_190 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&writer_1,(lazy_ostream *)&ser,1,0,WARN,_cVar18,(size_t)&local_198,
             0x29);
  boost::detail::shared_count::~shared_count(&sStack_158);
  if (depgraph_read.entries.
      super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(depgraph_read.entries.
                    super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)depgraph_read.entries.
                          super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)depgraph_read.entries.
                          super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (depgraph.entries.
      super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(depgraph.entries.
                    super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)depgraph.entries.
                          super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)depgraph.entries.
                          super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TestDepGraphSerialization(const Cluster<SetType>& cluster, const std::string& hexenc)
{
    DepGraph depgraph(cluster);

    // Run normal sanity and correspondence checks, which includes a round-trip test.
    VerifyDepGraphFromCluster(cluster, depgraph);

    // There may be multiple serializations of the same graph, but DepGraphFormatter's serializer
    // only produces one of those. Verify that hexenc matches that canonical serialization.
    std::vector<unsigned char> encoding;
    VectorWriter writer(encoding, 0);
    writer << Using<DepGraphFormatter>(depgraph);
    BOOST_CHECK_EQUAL(HexStr(encoding), hexenc);

    // Test that deserializing that encoding yields depgraph. This is effectively already implied
    // by the round-trip test above (if depgraph is acyclic), but verify it explicitly again here.
    SpanReader reader(encoding);
    DepGraph<SetType> depgraph_read;
    reader >> Using<DepGraphFormatter>(depgraph_read);
    BOOST_CHECK(depgraph == depgraph_read);
}